

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O2

void Pdr_ManStop(Pdr_Man_t *p)

{
  void **__ptr;
  Vec_Wec_t *__ptr_00;
  sat_solver *s;
  Vec_Ptr_t *pVVar1;
  Pdr_Set_t *p_00;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int i;
  int iVar4;
  Aig_Man_t *pAVar5;
  Vec_Vec_t *p_01;
  long lVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  pAVar5 = p->pAig;
  Aig_ManCleanMarkAB(pAVar5);
  iVar4 = (int)pAVar5;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(iVar4,"Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Start =%4d\n",
              ((double)p->nCallsS * 100.0) / (double)p->nCalls,(ulong)(uint)p->nBlocks,
              (ulong)(uint)p->nObligs,(ulong)(uint)p->nCubes,(ulong)(uint)p->nCalls,p->nStarts);
    Abc_Print(iVar4,"%s =","SAT solving");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tSat / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","  unsat    ");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tSatUnsat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tSatUnsat / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","  sat      ");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tSatSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tSatSat / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","Generalize ");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tGeneral * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tGeneral / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","Push clause");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tPush * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tPush / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","Ternary sim");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tTsim * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tTsim / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","Containment");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tContain * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tContain / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","CNF compute");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tCnf * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->tCnf / 1000000.0,dVar9);
    Abc_Print(iVar4,"%s =","TOTAL      ");
    dVar9 = (double)p->tTotal;
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = (dVar9 * 100.0) / dVar9;
    }
    Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar9 / 1000000.0,dVar10);
    fflush(_stdout);
  }
  for (iVar4 = 0; pVVar1 = p->vSolvers, iVar4 < pVVar1->nSize; iVar4 = iVar4 + 1) {
    s = (sat_solver *)Vec_PtrEntry(pVVar1,iVar4);
    sat_solver_delete(s);
  }
  Vec_PtrFree(pVVar1);
  iVar4 = 0;
  while( true ) {
    p_01 = p->vClauses;
    iVar7 = p_01->nSize;
    if (iVar7 <= iVar4) break;
    iVar7 = 0;
    while( true ) {
      pVVar1 = Vec_VecEntry(p_01,iVar4);
      if (pVVar1->nSize <= iVar7) break;
      pVVar1 = Vec_VecEntry(p->vClauses,iVar4);
      p_00 = (Pdr_Set_t *)Vec_PtrEntry(pVVar1,iVar7);
      Pdr_SetDeref(p_00);
      iVar7 = iVar7 + 1;
      p_01 = p->vClauses;
    }
    iVar4 = iVar4 + 1;
  }
  for (iVar4 = 0; iVar4 < iVar7; iVar4 = iVar4 + 1) {
    pVVar1 = Vec_VecEntry(p_01,iVar4);
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(pVVar1);
    }
    iVar7 = p_01->nSize;
  }
  Vec_PtrFree((Vec_Ptr_t *)p_01);
  Pdr_QueueStop(p);
  if (p->pOrder != (int *)0x0) {
    free(p->pOrder);
    p->pOrder = (int *)0x0;
  }
  Vec_IntFree(p->vActVars);
  Cnf_DataFree(p->pCnf1);
  Vec_IntFreeP(&p->vVar2Reg);
  Cnf_DataFree(p->pCnf2);
  pVVar2 = p->pvId2Vars;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    lVar6 = 8;
    for (lVar8 = 0; lVar8 < p->pAig->vObjs->nSize; lVar8 = lVar8 + 1) {
      pvVar3 = *(void **)((long)&pVVar2->nCap + lVar6);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        pVVar2 = p->pvId2Vars;
        *(undefined8 *)((long)&pVVar2->nCap + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    }
    free(pVVar2);
    p->pvId2Vars = (Vec_Int_t *)0x0;
  }
  for (iVar4 = 0; iVar4 < (p->vVar2Ids).nSize; iVar4 = iVar4 + 1) {
    pVVar2 = (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids,iVar4);
    Vec_IntFree(pVVar2);
  }
  __ptr = (p->vVar2Ids).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vVar2Ids).pArray = (void **)0x0;
  }
  __ptr_00 = p->vVLits;
  if (__ptr_00 != (Vec_Wec_t *)0x0) {
    pVVar2 = __ptr_00->pArray;
    lVar6 = 8;
    for (lVar8 = 0; lVar8 < __ptr_00->nCap; lVar8 = lVar8 + 1) {
      pvVar3 = *(void **)((long)&pVVar2->nCap + lVar6);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        pVVar2 = __ptr_00->pArray;
        *(undefined8 *)((long)&pVVar2->nCap + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    }
    free(pVVar2);
    free(__ptr_00);
    p->vVLits = (Vec_Wec_t *)0x0;
  }
  Cnf_ManStop(p->pCnfMan);
  Vec_IntFreeP(&p->vPrio);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vCiObjs);
  Vec_IntFree(p->vCoObjs);
  Vec_IntFree(p->vCiVals);
  Vec_IntFree(p->vCoVals);
  Vec_IntFree(p->vNodes);
  Vec_IntFree(p->vUndo);
  Vec_IntFree(p->vVisits);
  Vec_IntFree(p->vCi2Rem);
  Vec_IntFree(p->vRes);
  Vec_IntFree(p->vSuppLits);
  pVVar1 = p->vInfCubes;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      p->vInfCubes->pArray = (void **)0x0;
      pVVar1 = p->vInfCubes;
      if (pVVar1 == (Vec_Ptr_t *)0x0) goto LAB_004948d9;
    }
    free(pVVar1);
    p->vInfCubes = (Vec_Ptr_t *)0x0;
  }
LAB_004948d9:
  if (p->pCubeJust != (Pdr_Set_t *)0x0) {
    free(p->pCubeJust);
    p->pCubeJust = (Pdr_Set_t *)0x0;
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar1 = p->vCexes;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    for (iVar4 = 0; iVar4 < pVVar1->nSize; iVar4 = iVar4 + 1) {
      pvVar3 = Vec_PtrEntry(pVVar1,iVar4);
      if ((void *)0x2 < pvVar3) {
        free(pvVar3);
      }
    }
    Vec_PtrFree(pVVar1);
  }
  pAVar5 = p->pAig;
  if (pAVar5->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(pAVar5);
    pAVar5 = p->pAig;
  }
  if (pAVar5->pTerSimData != (uint *)0x0) {
    free(pAVar5->pTerSimData);
    p->pAig->pTerSimData = (uint *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Pdr_ManStop( Pdr_Man_t * p )
{
    Pdr_Set_t * pCla;
    sat_solver * pSat;
    int i, k;
    Aig_ManCleanMarkAB( p->pAig );
    if ( p->pPars->fVerbose ) 
    {
        Abc_Print( 1, "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Start =%4d\n", 
            p->nBlocks, p->nObligs, p->nCubes, p->nCalls, 100.0 * p->nCallsS / p->nCalls, p->nStarts );
        ABC_PRTP( "SAT solving", p->tSat,       p->tTotal );
        ABC_PRTP( "  unsat    ", p->tSatUnsat,  p->tTotal );
        ABC_PRTP( "  sat      ", p->tSatSat,    p->tTotal );
        ABC_PRTP( "Generalize ", p->tGeneral,   p->tTotal );
        ABC_PRTP( "Push clause", p->tPush,      p->tTotal );
        ABC_PRTP( "Ternary sim", p->tTsim,      p->tTotal );
        ABC_PRTP( "Containment", p->tContain,   p->tTotal );
        ABC_PRTP( "CNF compute", p->tCnf,       p->tTotal );
        ABC_PRTP( "TOTAL      ", p->tTotal,     p->tTotal );
        fflush( stdout );
    }
//    Abc_Print( 1, "SS =%6d. SU =%6d. US =%6d. UU =%6d.\n", p->nCasesSS, p->nCasesSU, p->nCasesUS, p->nCasesUU );
    Vec_PtrForEachEntry( sat_solver *, p->vSolvers, pSat, i )
        sat_solver_delete( pSat );
    Vec_PtrFree( p->vSolvers );
    Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pCla, i, k )
        Pdr_SetDeref( pCla );
    Vec_VecFree( p->vClauses );
    Pdr_QueueStop( p );
    ABC_FREE( p->pOrder );
    Vec_IntFree( p->vActVars );
    // static CNF
    Cnf_DataFree( p->pCnf1 );
    Vec_IntFreeP( &p->vVar2Reg );
    // dynamic CNF
    Cnf_DataFree( p->pCnf2 );
    if ( p->pvId2Vars )
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        ABC_FREE( p->pvId2Vars[i].pArray );
    ABC_FREE( p->pvId2Vars );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vVar2Ids );
    for ( i = 0; i < Vec_PtrSize(&p->vVar2Ids); i++ )
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids, i) );
    ABC_FREE( p->vVar2Ids.pArray );
    Vec_WecFreeP( &p->vVLits );
    // CNF manager
    Cnf_ManStop( p->pCnfMan );
    // internal use
    Vec_IntFreeP( &p->vPrio   );  // priority flops
    Vec_IntFree( p->vLits     );  // array of literals
    Vec_IntFree( p->vCiObjs   );  // cone leaves
    Vec_IntFree( p->vCoObjs   );  // cone roots
    Vec_IntFree( p->vCiVals   );  // cone leaf values
    Vec_IntFree( p->vCoVals   );  // cone root values
    Vec_IntFree( p->vNodes    );  // cone nodes
    Vec_IntFree( p->vUndo     );  // cone undos
    Vec_IntFree( p->vVisits   );  // intermediate
    Vec_IntFree( p->vCi2Rem   );  // CIs to be removed
    Vec_IntFree( p->vRes      );  // final result
    Vec_IntFree( p->vSuppLits );  // support literals
    Vec_PtrFreeP( &p->vInfCubes );
    ABC_FREE( p->pCubeJust );
    ABC_FREE( p->pTime4Outs );
    if ( p->vCexes )
        Vec_PtrFreeFree( p->vCexes );
    // additional AIG data-members
    if ( p->pAig->pFanData != NULL )
        Aig_ManFanoutStop( p->pAig );
    if ( p->pAig->pTerSimData != NULL )
        ABC_FREE( p->pAig->pTerSimData );
    ABC_FREE( p );
}